

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void super_stats(int nsuper,int *xsup)

{
  uint uVar1;
  uint local_5c;
  uint local_58;
  int max_sup_size;
  int bucket [10];
  int bh;
  int bl;
  int whichb;
  int isize;
  int i;
  int nsup1;
  int *xsup_local;
  int nsuper_local;
  
  isize = 0;
  local_5c = 0;
  for (whichb = 0; whichb <= nsuper; whichb = whichb + 1) {
    uVar1 = xsup[whichb + 1] - xsup[whichb];
    if (uVar1 == 1) {
      isize = isize + 1;
    }
    if ((int)local_5c < (int)uVar1) {
      local_5c = uVar1;
    }
  }
  printf("    Supernode statistics:\n\tno of super = %d\n",(ulong)(nsuper + 1));
  printf("\tmax supernode size = %d\n",(ulong)local_5c);
  printf("\tno of size 1 supernodes = %d\n",(ulong)(uint)isize);
  ifill((int *)&local_58,10,0);
  for (whichb = 0; whichb <= nsuper; whichb = whichb + 1) {
    bh = (int)(((float)(xsup[whichb + 1] - xsup[whichb]) / (float)(int)local_5c) * 10.0);
    if (9 < bh) {
      bh = 9;
    }
    (&local_58)[bh] = (&local_58)[bh] + 1;
  }
  printf("\tHistogram of supernode sizes:\n");
  for (whichb = 0; whichb < 10; whichb = whichb + 1) {
    bucket[9] = (int)(((float)whichb * (float)(int)local_5c) / 10.0);
    bucket[8] = (int)(((float)(whichb + 1) * (float)(int)local_5c) / 10.0);
    printf("\tsnode: %d-%d\t\t%d\n",(ulong)(bucket[9] + 1),(ulong)(uint)bucket[8],
           (ulong)(&local_58)[whichb]);
  }
  return;
}

Assistant:

void super_stats(int nsuper, const int *xsup)
{
    register int nsup1 = 0;
    int    i, isize, whichb, bl, bh;
    int    bucket[NBUCKS];
    int    max_sup_size = 0;

    for (i = 0; i <= nsuper; i++) {
	isize = xsup[i+1] - xsup[i];
	if ( isize == 1 ) nsup1++;
	if ( max_sup_size < isize ) max_sup_size = isize;	
    }

    printf("    Supernode statistics:\n\tno of super = %d\n", nsuper+1);
    printf("\tmax supernode size = %d\n", max_sup_size);
    printf("\tno of size 1 supernodes = %d\n", nsup1);

    /* Histogram of the supernode sizes */
    ifill (bucket, NBUCKS, 0);

    for (i = 0; i <= nsuper; i++) {
        isize = xsup[i+1] - xsup[i];
        whichb = (float) isize / max_sup_size * NBUCKS;
        if (whichb >= NBUCKS) whichb = NBUCKS - 1;
        bucket[whichb]++;
    }
    
    printf("\tHistogram of supernode sizes:\n");
    for (i = 0; i < NBUCKS; i++) {
        bl = (float) i * max_sup_size / NBUCKS;
        bh = (float) (i+1) * max_sup_size / NBUCKS;
        printf("\tsnode: %d-%d\t\t%d\n", bl+1, bh, bucket[i]);
    }

}